

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O3

void NULLCFile::FileOpen(NULLCArray name,NULLCArray access,File *file)

{
  FILE *pFVar1;
  char *__modes;
  char *__filename;
  
  __modes = access.ptr;
  __filename = name.ptr;
  if (file != (File *)0x0) {
    if ((file->flag & 1) != 0) {
      fclose((FILE *)file->handle);
    }
    if (__filename == (char *)0x0) {
      __filename = "";
    }
    file->flag = 1;
    if (__modes == (char *)0x0) {
      __modes = "";
    }
    pFVar1 = fopen(__filename,__modes);
    file->handle = (FILE *)pFVar1;
    if (pFVar1 == (FILE *)0x0) {
      file->flag = 0;
    }
    return;
  }
  nullcThrowError("ERROR: null pointer access",
                  CONCAT44((int)((ulong)register0x00000030 >> 0x20),name.len),__modes,access.len);
  return;
}

Assistant:

void FileOpen(NULLCArray name, NULLCArray access, File* file)
	{
		if(!file)
		{
			nullcThrowError("ERROR: null pointer access");
			return;
		}

		if(file->flag & FILE_OPENED)
			fclose(file->handle);

		file->flag = FILE_OPENED;
		file->handle = fopen(name.ptr ? name.ptr : "", access.ptr ? access.ptr : "");

		if(!file->handle)
			file->flag = 0;
	}